

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laserDriver.h
# Opt level: O1

bool checkRPLIDARHealth(RPlidarDriver *drv)

{
  uint uVar1;
  bool bVar2;
  rplidar_response_device_health_t healthinfo;
  byte local_b [3];
  
  uVar1 = (**(code **)(*(long *)drv + 0x48))(drv,local_b,2000);
  if ((int)uVar1 < 0) {
    bVar2 = false;
    fprintf(_stderr,"Error, cannot retrieve the lidar health code: %x\n",(ulong)uVar1);
  }
  else {
    printf("RPLidar health status : %d\n",(ulong)local_b[0]);
    bVar2 = true;
    if (local_b[0] == 2) {
      checkRPLIDARHealth();
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool checkRPLIDARHealth(RPlidarDriver * drv)
{
    u_result     op_result;
    rplidar_response_device_health_t healthinfo;


    op_result = drv->getHealth(healthinfo);
    if (IS_OK(op_result)) { // the macro IS_OK is the preperred way to judge whether the operation is succeed.
        printf("RPLidar health status : %d\n", healthinfo.status);
        if (healthinfo.status == RPLIDAR_STATUS_ERROR) {
            fprintf(stderr, "Error, rplidar internal error detected. Please reboot the device to retry.\n");
            // enable the following code if you want rplidar to be reboot by software
            // drv->reset();
            return false;
        } else {
            return true;
        }

    } else {
        fprintf(stderr, "Error, cannot retrieve the lidar health code: %x\n", op_result);
        return false;
    }
}